

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesDeviceSetEccStatePrologue
          (ZESParameterValidation *this,zes_device_handle_t hDevice,zes_device_ecc_desc_t *newState,
          zes_device_ecc_properties_t *pState)

{
  zes_structure_type_t *pzVar1;
  zes_structure_type_t *pzVar2;
  ze_result_t zVar3;
  bool bVar4;
  initializer_list<_zes_structure_type_t> __l;
  vector<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_> baseTypes;
  allocator_type local_2d;
  _zes_structure_type_t local_2c;
  vector<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_> local_28;
  
  if (hDevice == (zes_device_handle_t)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((pState != (zes_device_ecc_properties_t *)0x0 && newState != (zes_device_ecc_desc_t *)0x0)
       && (zVar3 = ZE_RESULT_ERROR_INVALID_ENUMERATION, (int)newState->state < 3)) {
      local_2c = ZES_STRUCTURE_TYPE_DEVICE_ECC_DESC;
      __l._M_len = 1;
      __l._M_array = &local_2c;
      std::vector<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>::vector
                (&local_28,__l,&local_2d);
      zVar3 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
      if (local_28.super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_28.super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = false;
        pzVar1 = local_28.
                 super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          pzVar2 = pzVar1 + 1;
          if (newState->stype == *pzVar1) {
            bVar4 = true;
            break;
          }
          pzVar1 = pzVar2;
        } while (pzVar2 != local_28.
                           super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if ((bVar4) && (((int *)newState->pNext == (int *)0x0 || (*newState->pNext < 0x100000)))) {
          zVar3 = ZE_RESULT_SUCCESS;
        }
      }
      if (local_28.super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (zes_structure_type_t *)0x0) {
        operator_delete(local_28.
                        super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<_zes_structure_type_t,_std::allocator<_zes_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesDeviceSetEccStatePrologue(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        const zes_device_ecc_desc_t* newState,          ///< [in] Pointer to desired ECC state.
        zes_device_ecc_properties_t* pState             ///< [out] ECC state, pending state, and pending action for state change.
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == newState )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pState )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZES_DEVICE_ECC_STATE_DISABLED < newState->state )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        auto retVal = ZE_RESULT_SUCCESS;
        retVal = ParameterValidation::validateExtensions(newState);
        if(retVal)
            return retVal;
        retVal = ParameterValidation::validateExtensions(pState);
        return retVal;
    }